

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int get_relative_field_bit_offset_by_index
              (coda_cursor *cursor,long field_index,int64_t *rel_bit_offset)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int local_374;
  long lStack_370;
  int available_1;
  int64_t bit_size;
  coda_dynamic_type_struct *pcStack_360;
  int available;
  long i;
  long index;
  int64_t prev_bit_offset;
  coda_cursor field_cursor;
  coda_type_record *record;
  coda_type_record_field *field;
  int64_t *rel_bit_offset_local;
  long field_index_local;
  coda_cursor *cursor_local;
  
  field_cursor.stack[0x1f].bit_offset = (int64_t)cursor->stack[cursor->n + -1].type;
  lVar1 = *(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) + field_index * 8);
  if (*(long *)(lVar1 + 0x28) < 0) {
    if (*(long *)(lVar1 + 0x30) == 0) {
      if (field_index == 0) {
        __assert_fail("field_index != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,99,
                      "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                     );
      }
      i = field_index + -1;
      while( true ) {
        bVar3 = false;
        if (*(long *)(*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) + i * 8) +
                     0x28) == -1) {
          bVar3 = *(long *)(*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) + i * 8)
                           + 0x30) == 0;
        }
        if (!bVar3) break;
        i = i + -1;
        if (i < 0) {
          __assert_fail("index >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                        ,0x6e,
                        "int get_relative_field_bit_offset_by_index(const coda_cursor *, long, int64_t *)"
                       );
        }
      }
      iVar2 = get_relative_field_bit_offset_by_index(cursor,i,&index);
      if (iVar2 == 0) {
        memcpy(&prev_bit_offset,cursor,0x310);
        field_cursor.stack[(int)field_cursor.product].index =
             cursor->stack[cursor->n + -1].bit_offset + index;
        field_cursor.product._0_4_ = (int)field_cursor.product + 1;
        for (pcStack_360 = (coda_dynamic_type_struct *)i; (long)pcStack_360 < field_index;
            pcStack_360 = (coda_dynamic_type_struct *)((long)&pcStack_360->backend + 1)) {
          local_374 = 1;
          if ((*(long *)(*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) +
                                  (long)pcStack_360 * 8) + 0x20) != 0) &&
             (iVar2 = coda_expression_eval_bool
                                (*(coda_expression **)
                                  (*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) +
                                            (long)pcStack_360 * 8) + 0x20),cursor,&local_374),
             iVar2 != 0)) {
            coda_add_error_message(" for available expression");
            return -1;
          }
          if (local_374 != 0) {
            field_cursor.stack[(long)((int)field_cursor.product + -1) + -1].bit_offset =
                 *(int64_t *)
                  (*(long *)(*(long *)(field_cursor.stack[0x1f].bit_offset + 0x50) +
                            (long)pcStack_360 * 8) + 0x10);
            field_cursor.stack[(int)field_cursor.product + -1].type = pcStack_360;
            iVar2 = coda_cursor_get_bit_size
                              ((coda_cursor *)&prev_bit_offset,&stack0xfffffffffffffc90);
            if (iVar2 != 0) {
              return -1;
            }
            index = lStack_370 + index;
            field_cursor.stack[(int)field_cursor.product + -1].index =
                 lStack_370 + field_cursor.stack[(int)field_cursor.product + -1].index;
          }
        }
        *rel_bit_offset = index;
        cursor_local._4_4_ = 0;
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      if (*(long *)(lVar1 + 0x20) != 0) {
        iVar2 = coda_expression_eval_bool
                          (*(coda_expression **)(lVar1 + 0x20),cursor,(int *)((long)&bit_size + 4));
        if (iVar2 != 0) {
          coda_add_error_message(" for available expression");
          coda_cursor_add_to_error_message(cursor);
          return -1;
        }
        if (bit_size._4_4_ == 0) {
          if (field_index == 0) {
            *rel_bit_offset = 0;
            return 0;
          }
          iVar2 = get_relative_field_bit_offset_by_index(cursor,field_index + -1,rel_bit_offset);
          return iVar2;
        }
      }
      iVar2 = coda_expression_eval_integer
                        (*(coda_expression **)(lVar1 + 0x30),cursor,rel_bit_offset);
      if (iVar2 == 0) {
        cursor_local._4_4_ = 0;
      }
      else {
        coda_add_error_message(" for offset expression");
        coda_cursor_add_to_error_message(cursor);
        cursor_local._4_4_ = -1;
      }
    }
  }
  else {
    *rel_bit_offset = *(int64_t *)(lVar1 + 0x28);
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

static int get_relative_field_bit_offset_by_index(const coda_cursor *cursor, long field_index, int64_t *rel_bit_offset)
{
    coda_type_record_field *field;
    coda_type_record *record;
    coda_cursor field_cursor;
    int64_t prev_bit_offset;
    long index;
    long i;

    record = (coda_type_record *)cursor->stack[cursor->n - 1].type;
    field = record->field[field_index];

    if (field->bit_offset >= 0)
    {
        /* use static offset */
        *rel_bit_offset = field->bit_offset;
        return 0;
    }

    if (field->bit_offset_expr != NULL)
    {
        if (field->available_expr != NULL)
        {
            int available;

            if (coda_expression_eval_bool(field->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
            /* don't evaluate offset expression if field is not available! */
            if (!available)
            {
                if (field_index == 0)
                {
                    /* Just set to 0. With a proper format definition you should actually never have this case. */
                    *rel_bit_offset = 0;
                    return 0;
                }
                else
                {
                    /* the size of this field is zero, so just use the offset of the previous field */
                    return get_relative_field_bit_offset_by_index(cursor, field_index - 1, rel_bit_offset);
                }
            }
        }
        /* determine offset using expr */
        if (coda_expression_eval_integer(field->bit_offset_expr, cursor, rel_bit_offset) != 0)
        {
            coda_add_error_message(" for offset expression");
            coda_cursor_add_to_error_message(cursor);
            return -1;
        }
        return 0;
    }

    assert(field_index != 0);   /* the first field should either have a fixed bit offset or a bit_offset_expr */

    /* determine offset by:
     *  - finding previous field with a fixed bit_offset or a bit_offset_expr
     *  - calculating the bit offset for that field
     *  - adding bit sizes of fields after that offset until we get to our field
     */
    index = field_index - 1;
    while (record->field[index]->bit_offset == -1 && record->field[index]->bit_offset_expr == NULL)
    {
        index--;
        assert(index >= 0);
    }
    if (get_relative_field_bit_offset_by_index(cursor, index, &prev_bit_offset) != 0)
    {
        return -1;
    }
    field_cursor = *cursor;
    field_cursor.n++;
    field_cursor.stack[field_cursor.n - 1].bit_offset = cursor->stack[cursor->n - 1].bit_offset + prev_bit_offset;
    for (i = index; i < field_index; i++)
    {
        int64_t bit_size;
        int available = 1;

        if (record->field[i]->available_expr != NULL)
        {
            if (coda_expression_eval_bool(record->field[i]->available_expr, cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                return -1;
            }
        }
        if (available)
        {
            field_cursor.stack[field_cursor.n - 1].type = (coda_dynamic_type *)record->field[i]->type;
            field_cursor.stack[field_cursor.n - 1].index = i;
            if (coda_cursor_get_bit_size(&field_cursor, &bit_size) != 0)
            {
                return -1;
            }
            prev_bit_offset += bit_size;
            field_cursor.stack[field_cursor.n - 1].bit_offset += bit_size;
        }
    }
    *rel_bit_offset = prev_bit_offset;

    return 0;
}